

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::verify_generator_connectivity(Generator *top)

{
  undefined1 local_60 [8];
  GeneratorConnectivityVisitor visitor;
  Generator *top_local;
  
  visitor._72_8_ = top;
  GeneratorConnectivityVisitor::GeneratorConnectivityVisitor
            ((GeneratorConnectivityVisitor *)local_60);
  IRVisitor::visit_generator_root((IRVisitor *)local_60,(Generator *)visitor._72_8_);
  GeneratorConnectivityVisitor::~GeneratorConnectivityVisitor
            ((GeneratorConnectivityVisitor *)local_60);
  return;
}

Assistant:

void verify_generator_connectivity(Generator* top) {
    GeneratorConnectivityVisitor visitor;
    visitor.visit_generator_root(top);
}